

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::Compiler::register_read
          (Compiler *this,uint32_t expr,uint32_t chain,bool forwarded)

{
  uint32_t *puVar1;
  size_t sVar2;
  bool bVar3;
  SPIRExpression *pSVar4;
  SPIRVariable *pSVar5;
  
  pSVar4 = Variant::get<diligent_spirv_cross::SPIRExpression>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr + expr);
  pSVar5 = maybe_get_backing_variable(this,chain);
  if (pSVar5 != (SPIRVariable *)0x0) {
    (pSVar4->loaded_from).id = (pSVar5->super_IVariant).self.id;
    if (forwarded) {
      bVar3 = is_immutable(this,(pSVar5->super_IVariant).self.id);
      if (!bVar3) {
        SmallVector<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_8UL>::reserve
                  (&pSVar5->dependees,
                   (pSVar5->dependees).
                   super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                   buffer_size + 1);
        sVar2 = (pSVar5->dependees).
                super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
                buffer_size;
        (pSVar5->dependees).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr[sVar2].
        id = (pSVar4->super_IVariant).self.id;
        (pSVar5->dependees).
        super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.buffer_size
             = sVar2 + 1;
      }
    }
    if (pSVar5->parameter != (Parameter *)0x0) {
      puVar1 = &pSVar5->parameter->read_count;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void Compiler::register_read(uint32_t expr, uint32_t chain, bool forwarded)
{
	auto &e = get<SPIRExpression>(expr);
	auto *var = maybe_get_backing_variable(chain);

	if (var)
	{
		e.loaded_from = var->self;

		// If the backing variable is immutable, we do not need to depend on the variable.
		if (forwarded && !is_immutable(var->self))
			var->dependees.push_back(e.self);

		// If we load from a parameter, make sure we create "inout" if we also write to the parameter.
		// The default is "in" however, so we never invalidate our compilation by reading.
		if (var && var->parameter)
			var->parameter->read_count++;
	}
}